

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_match_here(char *regexp,char *text)

{
  char *in_RSI;
  char *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar1;
  
  if (*in_RDI == '\0') {
    uVar1 = 1;
  }
  else if (in_RDI[1] == '*') {
    uVar1 = nk_str_match_star((int)text,
                              (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI);
  }
  else if ((*in_RDI == '$') && (in_RDI[1] == '\0')) {
    uVar1 = (uint)(*in_RSI == '\0');
  }
  else if ((*in_RSI == '\0') || ((*in_RDI != '.' && (*in_RDI != *in_RSI)))) {
    uVar1 = 0;
  }
  else {
    uVar1 = nk_str_match_here(in_RSI,(char *)0x10990d);
  }
  return uVar1;
}

Assistant:

NK_INTERN int
nk_str_match_here(const char *regexp, const char *text)
{
    if (regexp[0] == '\0')
        return 1;
    if (regexp[1] == '*')
        return nk_str_match_star(regexp[0], regexp+2, text);
    if (regexp[0] == '$' && regexp[1] == '\0')
        return *text == '\0';
    if (*text!='\0' && (regexp[0]=='.' || regexp[0]==*text))
        return nk_str_match_here(regexp+1, text+1);
    return 0;
}